

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::RefineEntropyCodes<brotli::Histogram<256>,unsigned_char>
               (uchar *data,size_t length,size_t stride,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec)

{
  pointer pHVar1;
  ulong uVar2;
  ulong uVar3;
  size_t iter;
  ulong uVar4;
  uint seed;
  Histogram<256> sample;
  uint local_44c;
  uchar *local_448;
  Histogram<256> local_440;
  
  local_44c = 7;
  uVar2 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x410;
  uVar3 = (length * 2) / stride + uVar2 + 99;
  local_448 = data;
  for (uVar4 = 0; uVar4 < uVar3 - uVar3 % uVar2; uVar4 = uVar4 + 1) {
    memset(&local_440,0,0x408);
    local_440.bit_cost_ = INFINITY;
    RandomSample<brotli::Histogram<256>,unsigned_char>
              (&local_44c,local_448,length,stride,&local_440);
    pHVar1 = (vec->
             super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    Histogram<256>::AddHistogram
              (pHVar1 + uVar4 % (ulong)(((long)(vec->
                                               super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pHVar1) / 0x410),&local_440);
  }
  return;
}

Assistant:

void RefineEntropyCodes(const DataType* data, size_t length,
                        size_t stride,
                        std::vector<HistogramType>* vec) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  iters = ((iters + vec->size() - 1) / vec->size()) * vec->size();
  for (size_t iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    RandomSample(&seed, data, length, stride, &sample);
    size_t ix = iter % vec->size();
    (*vec)[ix].AddHistogram(sample);
  }
}